

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesDH55
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  Hasher *pHVar1;
  char *pcVar2;
  int *piVar3;
  long lVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  Hasher *pHVar11;
  void *pvVar12;
  void *pvVar13;
  PreparedDictionary *pPVar14;
  int *piVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  uint8_t uVar20;
  Hasher *pHVar21;
  ulong uVar22;
  uint *puVar23;
  Hasher *pHVar24;
  char *pcVar25;
  uint uVar26;
  int iVar27;
  Hasher *pHVar28;
  long lVar29;
  Hasher *pHVar30;
  long lVar31;
  Hasher *pHVar32;
  uint uVar33;
  int iVar34;
  ulong *puVar35;
  long lVar36;
  ulong *puVar37;
  ulong *puVar38;
  Hasher *pHVar39;
  Hasher *pHVar40;
  ulong uVar41;
  short sVar42;
  ulong uVar43;
  uint32_t *puVar44;
  Hasher *pHVar45;
  byte bVar46;
  uint uVar47;
  Hasher *pHVar48;
  Hasher *pHVar49;
  Hasher *pHVar50;
  Hasher *pHVar51;
  ulong *puVar52;
  uint8_t *puVar53;
  Hasher *pHVar54;
  uint8_t *puVar55;
  uint8_t *puVar56;
  ulong *puVar57;
  uint8_t *s1_orig_1;
  uint8_t *s1_orig;
  Hasher *pHVar58;
  Hasher *pHVar59;
  uint32_t *puVar60;
  bool bVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  Hasher *local_180;
  Hasher *local_168;
  Hasher *local_160;
  ulong local_158;
  Hasher *local_150;
  Hasher *local_148;
  Hasher *local_140;
  Hasher *local_138;
  Hasher *local_118;
  Hasher *local_110;
  size_t *local_108;
  Hasher *local_f8;
  size_t cur_ix_masked;
  ulong local_50 [4];
  
  local_158 = *(ulong *)dist_cache;
  piVar3 = (int *)(position + num_bytes);
  pHVar21 = (Hasher *)((position - 7) + num_bytes);
  if (num_bytes < 8) {
    pHVar21 = (Hasher *)position;
  }
  pHVar40 = (Hasher *)0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    pHVar40 = (Hasher *)0x40;
  }
  if ((int *)(position + 8) < piVar3) {
    pHVar51 = (Hasher *)((1L << (literal_context_lut[8] & 0x3f)) + -0x10);
    lVar9 = *(long *)(literal_context_lut + 0x10);
    lVar10 = *(long *)(literal_context_lut + 0x60);
    local_138 = (Hasher *)((long)(pHVar40->common).extra + position);
    pHVar11 = (Hasher *)(params->dictionary).compound.num_chunks;
    uVar19 = (uint)ringbuffer_mask;
    pHVar1 = (Hasher *)((long)piVar3 + -7);
    lVar4 = position - 1;
    local_108 = last_insert_len;
    local_118 = pHVar40;
    local_180 = (Hasher *)position;
    do {
      local_168 = (Hasher *)((long)piVar3 - (long)local_180);
      pHVar24 = pHVar51;
      if (local_180 < pHVar51) {
        pHVar24 = local_180;
      }
      pHVar45 = (Hasher *)((long)(local_180->common).extra + lVar9);
      if (pHVar51 <= pHVar45) {
        pHVar45 = pHVar51;
      }
      uVar22 = (ulong)local_180 & ringbuffer_mask;
      pHVar39 = (Hasher *)(ringbuffer + uVar22);
      uVar20 = ringbuffer[uVar22];
      pHVar28 = (Hasher *)(long)*(int *)(hasher->common).extra;
      local_150 = (Hasher *)0x7e4;
      if (((Hasher *)((long)local_180 - (long)pHVar28) < local_180) &&
         (uVar33 = (uint)(Hasher *)((long)local_180 - (long)pHVar28) & uVar19,
         uVar20 == ringbuffer[uVar33])) {
        puVar35 = (ulong *)(ringbuffer + uVar33);
        pHVar30 = pHVar39;
        puVar52 = puVar35;
        local_148 = local_118;
        for (pHVar32 = local_168; (Hasher *)0x7 < pHVar32;
            pHVar32 = (Hasher *)((long)&pHVar32[-1].privat + 0x418)) {
          pvVar12 = (pHVar30->common).extra[0];
          pvVar13 = (void *)*puVar52;
          if (pvVar12 == pvVar13) {
            puVar52 = puVar52 + 1;
          }
          else {
            uVar43 = 0;
            if (((ulong)pvVar13 ^ (ulong)pvVar12) != 0) {
              for (; (((ulong)pvVar13 ^ (ulong)pvVar12) >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
              }
            }
            local_148 = (Hasher *)((long)puVar52 + ((uVar43 >> 3 & 0x1fffffff) - (long)puVar35));
          }
          if (pvVar12 != pvVar13) goto LAB_01c194f5;
          pHVar30 = (Hasher *)((pHVar30->common).extra + 1);
        }
        puVar57 = puVar52;
        if (pHVar32 != (Hasher *)0x0) {
          puVar57 = (ulong *)((long)puVar52 + (long)pHVar32);
          pHVar49 = (Hasher *)0x0;
          do {
            if (*(char *)((long)puVar52 + (long)pHVar49) !=
                *(char *)((long)(pHVar30->common).extra + (long)(pHVar49->common).extra)) {
              puVar57 = (ulong *)((long)puVar52 + (long)pHVar49);
              break;
            }
            pHVar49 = (Hasher *)((long)(pHVar49->common).extra + 1);
          } while (pHVar32 != pHVar49);
        }
        local_148 = (Hasher *)((long)puVar57 - (long)puVar35);
LAB_01c194f5:
        if ((local_148 < (Hasher *)0x4) ||
           (pHVar32 = (Hasher *)((long)local_148 * 0x87 + 0x78f), pHVar32 < (Hasher *)0x7e5)) {
          pHVar28 = (Hasher *)0x0;
          local_148 = (Hasher *)0x0;
        }
        else {
          uVar20 = *(uint8_t *)((long)(pHVar39->common).extra + (long)(local_148->common).extra);
          local_150 = pHVar32;
        }
      }
      else {
        pHVar28 = (Hasher *)0x0;
        local_148 = (Hasher *)0x0;
      }
      uVar33 = (uint)((ulong)(*(long *)(ringbuffer + uVar22) * -0x1ca5842ca8642d00) >> 0x2c);
      lVar29 = 0;
      lVar62 = 0;
      lVar63 = 1;
      do {
        local_50[lVar29 + -1] = lVar62 * 8 + (ulong)uVar33 & 0xfffff;
        local_50[lVar29] = lVar63 * 8 + (ulong)uVar33 & 0xfffff;
        lVar29 = lVar29 + 2;
        lVar62 = lVar62 + 2;
        lVar63 = lVar63 + 2;
      } while (lVar29 != 4);
      uVar33 = (uint)local_180;
      lVar62 = 0;
      local_110 = pHVar28;
      do {
        uVar47 = *(uint32_t *)((long)(pHVar11->common).extra + local_50[lVar62 + -1] * 4);
        puVar52 = (ulong *)(ringbuffer + (uVar19 & uVar47));
        if (((uVar20 == *(uint8_t *)((long)(local_148->common).extra + (long)puVar52)) &&
            (local_180 != (Hasher *)(ulong)uVar47)) &&
           (pHVar48 = (Hasher *)((long)local_180 - (long)(ulong)uVar47), pHVar32 = pHVar11,
           pHVar30 = local_168, pHVar49 = pHVar39, puVar35 = puVar52, pHVar48 <= pHVar24)) {
          for (; pHVar28 = pHVar49, (Hasher *)0x7 < pHVar30;
              pHVar30 = (Hasher *)((long)&pHVar30[-1].privat + 0x418)) {
            pvVar12 = (pHVar28->common).extra[0];
            pvVar13 = (void *)*puVar35;
            if (pvVar12 == pvVar13) {
              puVar35 = puVar35 + 1;
            }
            else {
              uVar43 = 0;
              if (((ulong)pvVar13 ^ (ulong)pvVar12) != 0) {
                for (; (((ulong)pvVar13 ^ (ulong)pvVar12) >> uVar43 & 1) == 0; uVar43 = uVar43 + 1)
                {
                }
              }
              pHVar32 = (Hasher *)((long)puVar35 + ((uVar43 >> 3 & 0x1fffffff) - (long)puVar52));
            }
            if (pvVar12 != pvVar13) goto LAB_01c18425;
            pHVar49 = (Hasher *)((pHVar28->common).extra + 1);
          }
          puVar57 = puVar35;
          if (pHVar30 != (Hasher *)0x0) {
            puVar57 = (ulong *)((long)puVar35 + (long)pHVar30);
            pHVar32 = (Hasher *)0x0;
            do {
              if (*(char *)((long)puVar35 + (long)pHVar32) !=
                  *(char *)((long)(pHVar28->common).extra + (long)(pHVar32->common).extra)) {
                puVar57 = (ulong *)((long)puVar35 + (long)pHVar32);
                break;
              }
              pHVar32 = (Hasher *)((long)(pHVar32->common).extra + 1);
            } while (pHVar30 != pHVar32);
          }
          pHVar32 = (Hasher *)((long)puVar57 - (long)puVar52);
LAB_01c18425:
          if ((Hasher *)0x3 < pHVar32) {
            iVar34 = 0x1f;
            if ((uint)pHVar48 != 0) {
              for (; (uint)pHVar48 >> iVar34 == 0; iVar34 = iVar34 + -1) {
              }
            }
            pHVar30 = (Hasher *)((ulong)(iVar34 * -0x1e + 0x780) + (long)pHVar32 * 0x87);
            if (local_150 < pHVar30) {
              uVar20 = *(uint8_t *)((long)(pHVar39->common).extra + (long)(pHVar32->common).extra);
              local_148 = pHVar32;
              local_150 = pHVar30;
              local_110 = pHVar48;
            }
          }
        }
        lVar62 = lVar62 + 1;
      } while (lVar62 != 4);
      *(uint *)((long)(pHVar11->common).extra +
               *(long *)((long)local_50 + ((ulong)(uVar33 & 0x18) - 8)) * 4) = uVar33;
      if ((Hasher *)0x1f < local_168 && ((ulong)local_180 & 3) == 0) {
        pHVar32 = (Hasher *)(params->dictionary).compound.chunks[1];
        if (pHVar32 <= local_180) {
          uVar47 = (uint)(params->dictionary).compound.total_size;
          iVar34 = *(int *)((long)(params->dictionary).compound.chunks + 0x14);
          iVar27 = *(int *)((params->dictionary).compound.chunks + 3);
          do {
            uVar26 = uVar47 & 0x3fffffff;
            bVar46 = ringbuffer[(ulong)pHVar32 & ringbuffer_mask];
            bVar5 = ringbuffer[(ulong)&(pHVar32->common).is_setup_ & ringbuffer_mask];
            if (uVar26 < 0x1000000) {
              pPVar14 = (params->dictionary).compound.chunks[0];
              uVar7 = (&pPVar14->magic)[uVar26];
              (&pPVar14->magic)[uVar26] = (uint32_t)pHVar32;
              if ((pHVar32 == local_180) && (uVar7 != 0xffffffff)) {
                uVar26 = uVar33 - uVar7;
                pHVar28 = (Hasher *)(ulong)uVar26;
                if (pHVar28 <= pHVar24) {
                  puVar35 = (ulong *)(ringbuffer + (uVar7 & uVar19));
                  pHVar49 = pHVar39;
                  puVar52 = puVar35;
                  pHVar48 = hasher;
                  for (pHVar30 = local_168; (Hasher *)0x7 < pHVar30;
                      pHVar30 = (Hasher *)((long)&pHVar30[-1].privat + 0x418)) {
                    pvVar12 = (pHVar49->common).extra[0];
                    pvVar13 = (void *)*puVar52;
                    if (pvVar12 == pvVar13) {
                      puVar52 = puVar52 + 1;
                    }
                    else {
                      uVar43 = 0;
                      if (((ulong)pvVar13 ^ (ulong)pvVar12) != 0) {
                        for (; (((ulong)pvVar13 ^ (ulong)pvVar12) >> uVar43 & 1) == 0;
                            uVar43 = uVar43 + 1) {
                        }
                      }
                      pHVar48 = (Hasher *)
                                ((long)puVar52 + ((uVar43 >> 3 & 0x1fffffff) - (long)puVar35));
                    }
                    if (pvVar12 != pvVar13) goto LAB_01c185d9;
                    pHVar49 = (Hasher *)((pHVar49->common).extra + 1);
                  }
                  puVar57 = puVar52;
                  if (pHVar30 != (Hasher *)0x0) {
                    puVar57 = (ulong *)((long)puVar52 + (long)pHVar30);
                    pHVar48 = (Hasher *)0x0;
                    do {
                      if (*(char *)((long)puVar52 + (long)pHVar48) !=
                          *(char *)((long)(pHVar49->common).extra + (long)(pHVar48->common).extra))
                      {
                        puVar57 = (ulong *)((long)puVar52 + (long)pHVar48);
                        break;
                      }
                      pHVar48 = (Hasher *)((long)(pHVar48->common).extra + 1);
                    } while (pHVar30 != pHVar48);
                  }
                  pHVar48 = (Hasher *)((long)puVar57 - (long)puVar35);
LAB_01c185d9:
                  if (((Hasher *)0x3 < pHVar48) && (local_148 < pHVar48)) {
                    iVar8 = 0x1f;
                    if (uVar26 != 0) {
                      for (; uVar26 >> iVar8 == 0; iVar8 = iVar8 + -1) {
                      }
                    }
                    pHVar30 = (Hasher *)((ulong)(iVar8 * -0x1e + 0x780) + (long)pHVar48 * 0x87);
                    if (local_150 < pHVar30) {
                      local_148 = pHVar48;
                      local_150 = pHVar30;
                      local_110 = pHVar28;
                    }
                  }
                }
              }
            }
            uVar47 = ~(uint)bVar46 * iVar27 + (uint)bVar5 + uVar47 * iVar34 + 1;
            pHVar32 = (Hasher *)((long)(pHVar32->common).extra + 4);
          } while (pHVar32 <= local_180);
          *(uint *)&(params->dictionary).compound.total_size = uVar47;
        }
        (params->dictionary).compound.chunks[1] =
             (PreparedDictionary *)((long)(local_180->common).extra + 4);
      }
      pHVar24 = *(Hasher **)(literal_context_lut + 0x48);
      lVar62 = *(long *)(literal_context_lut + 0x58);
      lVar63 = *(long *)(literal_context_lut + 0x60);
      local_118 = local_148;
      if (lVar62 != 0) {
        lVar29 = 0;
        do {
          piVar15 = *(int **)(literal_context_lut + lVar29 * 8 + 0x68);
          uVar43 = ((ulong)((long)(pHVar39->common).extra[0] << (-(char)piVar15[3] & 0x3fU)) >>
                   (-(char)piVar15[3] & 0x3fU)) * 0x1fe35a7bd3579bd3 >>
                   (-*(byte *)(piVar15 + 4) & 0x3f);
          pHVar30 = (Hasher *)(piVar15 + (1L << (*(byte *)(piVar15 + 5) & 0x3f)) + 6);
          pHVar32 = (Hasher *)
                    ((long)(pHVar30->common).extra + (1L << (*(byte *)(piVar15 + 4) & 0x3f)) * 2);
          bVar46 = -*(byte *)(piVar15 + 5);
          puVar60 = (uint32_t *)((long)(pHVar32->common).extra + (ulong)(uint)piVar15[1] * 4);
          if (*piVar15 != -0x21431220) {
            puVar60 = *(uint32_t **)puVar60;
          }
          pHVar49 = (Hasher *)
                    ((long)pHVar45 + (lVar63 - *(long *)(literal_context_lut + lVar29 * 8 + 0x168)))
          ;
          uVar41 = (ulong)(uint)piVar15[2];
          uVar6 = *(ushort *)((long)(pHVar30->common).extra + (uVar43 & 0xffffffff) * 2);
          puVar44 = (uint32_t *)
                    ((long)(pHVar32->common).extra +
                    (ulong)((uint)uVar6 +
                           piVar15[(ulong)((uint)((int)uVar43 << (bVar46 & 0x1f)) >> (bVar46 & 0x1f)
                                          ) + 6]) * 4);
          lVar36 = 0;
          local_f8 = local_148;
          do {
            pHVar48 = (Hasher *)(long)*(int *)((long)(hasher->common).extra + lVar36 * 4);
            if (((Hasher *)((long)pHVar49 - uVar41) < pHVar48) && (pHVar48 <= pHVar49)) {
              pHVar54 = (Hasher *)(uVar41 - ((long)pHVar49 - (long)pHVar48));
              if (local_168 <= pHVar54) {
                pHVar54 = local_168;
              }
              pHVar58 = (Hasher *)(((long)pHVar49 - (long)pHVar48) + (long)puVar60);
              pHVar59 = pHVar39;
              pHVar30 = pHVar58;
              for (; (Hasher *)0x7 < pHVar54;
                  pHVar54 = (Hasher *)((long)&pHVar54[-1].privat + 0x418)) {
                pHVar28 = (Hasher *)(pHVar59->common).extra[0];
                pHVar50 = (Hasher *)(pHVar30->common).extra[0];
                if (pHVar28 == pHVar50) {
                  pHVar30 = (Hasher *)((pHVar30->common).extra + 1);
                }
                else {
                  uVar43 = 0;
                  if (((ulong)pHVar50 ^ (ulong)pHVar28) != 0) {
                    for (; (((ulong)pHVar50 ^ (ulong)pHVar28) >> uVar43 & 1) == 0;
                        uVar43 = uVar43 + 1) {
                    }
                  }
                  pHVar32 = (Hasher *)((long)pHVar30 + ((uVar43 >> 3 & 0x1fffffff) - (long)pHVar58))
                  ;
                }
                if (pHVar28 != pHVar50) goto LAB_01c187fc;
                pHVar59 = (Hasher *)((pHVar59->common).extra + 1);
              }
              pHVar32 = pHVar30;
              if (pHVar54 != (Hasher *)0x0) {
                pHVar32 = (Hasher *)((long)(pHVar30->common).extra + (long)(pHVar54->common).extra);
                pHVar50 = (Hasher *)0x0;
                do {
                  if (*(char *)((long)(pHVar30->common).extra + (long)(pHVar50->common).extra) !=
                      *(char *)((long)(pHVar59->common).extra + (long)(pHVar50->common).extra)) {
                    pHVar32 = (Hasher *)
                              ((long)(pHVar30->common).extra + (long)(pHVar50->common).extra);
                    break;
                  }
                  pHVar50 = (Hasher *)((long)(pHVar50->common).extra + 1);
                } while (pHVar54 != pHVar50);
              }
              pHVar32 = (Hasher *)((long)pHVar32 - (long)pHVar58);
              pHVar30 = pHVar32;
LAB_01c187fc:
              if (((Hasher *)&DAT_00000001 < pHVar32) &&
                 (pHVar30 = (Hasher *)((long)pHVar32 * 0x87 + 0x78f), local_150 < pHVar30)) {
                if (lVar36 != 0) {
                  pHVar30 = (Hasher *)
                            ((long)pHVar30 - (ulong)((0x1ca10U >> ((byte)lVar36 & 2) & 4) + 0x27));
                }
                if ((local_150 < pHVar30) &&
                   (local_150 = pHVar30, local_148 = pHVar32, local_110 = pHVar48,
                   local_f8 < pHVar32)) {
                  local_f8 = pHVar32;
                }
              }
            }
            lVar36 = lVar36 + 1;
          } while (lVar36 != 4);
          if (uVar6 != 0xffff) {
            do {
              uVar33 = *puVar44;
              uVar43 = (ulong)(uVar33 & 0x7fffffff);
              pHVar32 = (Hasher *)((long)pHVar49 - uVar43);
              pHVar28 = (Hasher *)(uVar41 - uVar43);
              if (local_168 <= (Hasher *)(uVar41 - uVar43)) {
                pHVar28 = local_168;
              }
              if ((((pHVar32 <= pHVar24) &&
                   (pcVar25 = (char *)((long)(local_f8->common).extra + uVar22),
                   pcVar25 <= ringbuffer_mask)) && (local_f8 < pHVar28)) &&
                 (ringbuffer[(long)pcVar25] ==
                  *(uint8_t *)((long)puVar60 + (long)((long)(local_f8->common).extra + uVar43)))) {
                puVar35 = (ulong *)(uVar43 + (long)puVar60);
                pHVar48 = pHVar39;
                puVar52 = puVar35;
                for (; (Hasher *)0x7 < pHVar28;
                    pHVar28 = (Hasher *)((long)&pHVar28[-1].privat + 0x418)) {
                  pvVar12 = (pHVar48->common).extra[0];
                  pvVar13 = (void *)*puVar52;
                  if (pvVar12 == pvVar13) {
                    puVar52 = puVar52 + 1;
                  }
                  else {
                    uVar43 = 0;
                    if (((ulong)pvVar13 ^ (ulong)pvVar12) != 0) {
                      for (; (((ulong)pvVar13 ^ (ulong)pvVar12) >> uVar43 & 1) == 0;
                          uVar43 = uVar43 + 1) {
                      }
                    }
                    pHVar30 = (Hasher *)
                              ((long)puVar52 + ((uVar43 >> 3 & 0x1fffffff) - (long)puVar35));
                  }
                  if (pvVar12 != pvVar13) goto LAB_01c18972;
                  pHVar48 = (Hasher *)((pHVar48->common).extra + 1);
                }
                puVar57 = puVar52;
                if (pHVar28 != (Hasher *)0x0) {
                  puVar57 = (ulong *)((long)puVar52 + (long)pHVar28);
                  pHVar30 = (Hasher *)0x0;
                  do {
                    if (*(char *)((long)puVar52 + (long)pHVar30) !=
                        *(char *)((long)(pHVar48->common).extra + (long)(pHVar30->common).extra)) {
                      puVar57 = (ulong *)((long)puVar52 + (long)pHVar30);
                      break;
                    }
                    pHVar30 = (Hasher *)((long)(pHVar30->common).extra + 1);
                  } while (pHVar28 != pHVar30);
                }
                pHVar30 = (Hasher *)((long)puVar57 - (long)puVar35);
LAB_01c18972:
                if ((Hasher *)0x3 < pHVar30) {
                  iVar34 = 0x1f;
                  if ((uint)pHVar32 != 0) {
                    for (; (uint)pHVar32 >> iVar34 == 0; iVar34 = iVar34 + -1) {
                    }
                  }
                  pHVar48 = (Hasher *)((ulong)(iVar34 * -0x1e + 0x780) + (long)pHVar30 * 0x87);
                  if (local_150 < pHVar48) {
                    local_f8 = pHVar30;
                    local_150 = pHVar48;
                    local_148 = pHVar30;
                    local_110 = pHVar32;
                  }
                }
              }
              puVar44 = puVar44 + 1;
            } while (-1 < (int)uVar33);
          }
          lVar29 = lVar29 + 1;
          local_118 = local_148;
        } while (lVar29 != lVar62);
      }
      if (local_150 < (Hasher *)0x7e5) {
        local_158 = local_158 + 1;
        position = (long)(local_180->common).extra + 1;
        if (local_138 < position) {
          if ((Hasher *)((long)(local_138->common).extra + (ulong)(uint)((int)pHVar40 * 4)) <
              position) {
            pHVar24 = (Hasher *)((long)(local_180->common).extra + 0x11);
            if (pHVar1 <= pHVar24) {
              pHVar24 = pHVar1;
            }
            for (; position < pHVar24; position = (long)(((Hasher *)position)->common).extra + 4) {
              *(uint *)((long)(pHVar11->common).extra +
                       (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                             -0x1ca5842ca8642d00) >> 0x2c) + ((uint)position & 0x18)
                              & 0xfffff) * 4) = (uint)position;
              local_158 = local_158 + 4;
            }
          }
          else {
            pHVar24 = (Hasher *)((long)(local_180->common).extra + 9);
            if (pHVar1 <= pHVar24) {
              pHVar24 = pHVar1;
            }
            for (; position < pHVar24; position = (long)(((Hasher *)position)->common).extra + 2) {
              *(uint *)((long)(pHVar11->common).extra +
                       (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                             -0x1ca5842ca8642d00) >> 0x2c) + ((uint)position & 0x18)
                              & 0xfffff) * 4) = (uint)position;
              local_158 = local_158 + 2;
            }
          }
        }
      }
      else {
        lVar29 = (lVar4 + num_bytes) - (long)local_180;
        local_148 = local_118;
        iVar34 = 0;
        do {
          local_168 = (Hasher *)((long)&local_168[-1].privat + 0x41f);
          local_118 = (Hasher *)((long)&local_148[-1].privat + 0x41f);
          if (local_168 <= local_118) {
            local_118 = local_168;
          }
          if (4 < *(int *)(literal_context_lut + 4)) {
            local_118 = (Hasher *)0x0;
          }
          pHVar45 = (Hasher *)((long)(local_180->common).extra + 1);
          pHVar39 = pHVar51;
          if (pHVar45 < pHVar51) {
            pHVar39 = pHVar45;
          }
          pHVar32 = (Hasher *)((long)(local_180->common).extra + lVar9 + 1);
          if (pHVar51 <= pHVar32) {
            pHVar32 = pHVar51;
          }
          uVar22 = (ulong)pHVar45 & ringbuffer_mask;
          puVar52 = (ulong *)(ringbuffer + uVar22);
          uVar20 = *(uint8_t *)((long)(local_118->common).extra + (long)puVar52);
          local_140 = (Hasher *)(long)*(int *)(hasher->common).extra;
          local_160 = (Hasher *)0x7e4;
          pHVar30 = local_118;
          if (((Hasher *)((long)pHVar45 - (long)local_140) < pHVar45) &&
             (puVar37 = (ulong *)(ringbuffer +
                                 ((uint)(Hasher *)((long)pHVar45 - (long)local_140) & uVar19)),
             pHVar49 = local_168, puVar35 = puVar52, puVar57 = puVar37,
             uVar20 == *(uint8_t *)((long)(local_118->common).extra + (long)puVar37))) {
            for (; (Hasher *)0x7 < pHVar49; pHVar49 = (Hasher *)((long)&pHVar49[-1].privat + 0x418))
            {
              uVar43 = *puVar35;
              uVar41 = *puVar57;
              if (uVar43 == uVar41) {
                puVar57 = puVar57 + 1;
              }
              else {
                uVar16 = 0;
                if ((uVar41 ^ uVar43) != 0) {
                  for (; ((uVar41 ^ uVar43) >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                  }
                }
                pHVar30 = (Hasher *)((long)puVar57 + ((uVar16 >> 3 & 0x1fffffff) - (long)puVar37));
              }
              if (uVar43 != uVar41) goto LAB_01c19311;
              puVar35 = puVar35 + 1;
            }
            puVar38 = puVar57;
            if (pHVar49 != (Hasher *)0x0) {
              puVar38 = (ulong *)((long)puVar57 + (long)pHVar49);
              pHVar30 = (Hasher *)0x0;
              do {
                if (*(char *)((long)puVar57 + (long)pHVar30) !=
                    *(char *)((long)puVar35 + (long)pHVar30)) {
                  puVar38 = (ulong *)((long)puVar57 + (long)pHVar30);
                  break;
                }
                pHVar30 = (Hasher *)((long)(pHVar30->common).extra + 1);
              } while (pHVar49 != pHVar30);
            }
            pHVar30 = (Hasher *)((long)puVar38 - (long)puVar37);
LAB_01c19311:
            if ((pHVar30 < (Hasher *)0x4) ||
               (pHVar49 = (Hasher *)((long)pHVar30 * 0x87 + 0x78f), pHVar49 < (Hasher *)0x7e5)) {
              local_140 = (Hasher *)0x0;
            }
            else {
              uVar20 = *(uint8_t *)((long)puVar52 + (long)pHVar30);
              local_118 = pHVar30;
              local_160 = pHVar49;
            }
          }
          else {
            local_140 = (Hasher *)0x0;
          }
          uVar33 = (uint)((ulong)(*(long *)(ringbuffer + uVar22) * -0x1ca5842ca8642d00) >> 0x2c);
          lVar31 = 0;
          lVar36 = 0;
          lVar64 = 1;
          do {
            local_50[lVar31 + -1] = lVar36 * 8 + (ulong)uVar33 & 0xfffff;
            local_50[lVar31] = lVar64 * 8 + (ulong)uVar33 & 0xfffff;
            lVar31 = lVar31 + 2;
            lVar36 = lVar36 + 2;
            lVar64 = lVar64 + 2;
          } while (lVar31 != 4);
          uVar33 = (uint)pHVar45;
          lVar36 = 0;
          do {
            uVar47 = *(uint32_t *)((long)(pHVar11->common).extra + local_50[lVar36 + -1] * 4);
            puVar53 = ringbuffer + (uVar19 & uVar47);
            if (((uVar20 == puVar53[(long)&local_118->common]) &&
                (pHVar45 != (Hasher *)(ulong)uVar47)) &&
               (pHVar48 = (Hasher *)((long)pHVar45 - (long)(ulong)uVar47), pHVar49 = local_168,
               puVar35 = puVar52, puVar55 = puVar53, pHVar48 <= pHVar39)) {
              for (; (Hasher *)0x7 < pHVar49;
                  pHVar49 = (Hasher *)((long)&pHVar49[-1].privat + 0x418)) {
                pHVar30 = (Hasher *)*puVar35;
                pHVar54 = *(Hasher **)puVar55;
                if (pHVar30 == pHVar54) {
                  puVar55 = puVar55 + 8;
                }
                else {
                  uVar43 = 0;
                  if (((ulong)pHVar54 ^ (ulong)pHVar30) != 0) {
                    for (; (((ulong)pHVar54 ^ (ulong)pHVar30) >> uVar43 & 1) == 0;
                        uVar43 = uVar43 + 1) {
                    }
                  }
                  pHVar28 = (Hasher *)(puVar55 + ((uVar43 >> 3 & 0x1fffffff) - (long)puVar53));
                }
                if (pHVar30 != pHVar54) goto LAB_01c18ca4;
                puVar35 = puVar35 + 1;
              }
              puVar56 = puVar55;
              if (pHVar49 != (Hasher *)0x0) {
                puVar56 = puVar55 + (long)pHVar49;
                pHVar28 = (Hasher *)0x0;
                do {
                  pHVar30 = (Hasher *)CONCAT71((int7)((ulong)pHVar30 >> 8),puVar55[(long)pHVar28]);
                  if (puVar55[(long)pHVar28] != *(uint8_t *)((long)puVar35 + (long)pHVar28)) {
                    puVar56 = puVar55 + (long)pHVar28;
                    break;
                  }
                  pHVar28 = (Hasher *)((long)(pHVar28->common).extra + 1);
                } while (pHVar49 != pHVar28);
              }
              pHVar28 = (Hasher *)(puVar56 + -(long)puVar53);
LAB_01c18ca4:
              if ((Hasher *)0x3 < pHVar28) {
                iVar27 = 0x1f;
                if ((uint)pHVar48 != 0) {
                  for (; (uint)pHVar48 >> iVar27 == 0; iVar27 = iVar27 + -1) {
                  }
                }
                pHVar49 = (Hasher *)((ulong)(iVar27 * -0x1e + 0x780) + (long)pHVar28 * 0x87);
                if (local_160 < pHVar49) {
                  uVar20 = *(uint8_t *)((long)puVar52 + (long)pHVar28);
                  local_118 = pHVar28;
                  local_160 = pHVar49;
                  local_140 = pHVar48;
                }
              }
            }
            lVar36 = lVar36 + 1;
          } while (lVar36 != 4);
          *(uint *)((long)(pHVar11->common).extra +
                   *(long *)((long)local_50 + ((ulong)(uVar33 & 0x18) - 8)) * 4) = uVar33;
          if ((Hasher *)0x1f < local_168 && ((ulong)pHVar45 & 3) == 0) {
            pHVar49 = (Hasher *)(params->dictionary).compound.chunks[1];
            if (pHVar49 <= pHVar45) {
              uVar47 = (uint)(params->dictionary).compound.total_size;
              iVar27 = *(int *)((long)(params->dictionary).compound.chunks + 0x14);
              iVar8 = *(int *)((params->dictionary).compound.chunks + 3);
              do {
                uVar26 = uVar47 & 0x3fffffff;
                bVar46 = ringbuffer[(ulong)pHVar49 & ringbuffer_mask];
                bVar5 = ringbuffer[(ulong)&(pHVar49->common).is_setup_ & ringbuffer_mask];
                if (uVar26 < 0x1000000) {
                  pPVar14 = (params->dictionary).compound.chunks[0];
                  uVar7 = (&pPVar14->magic)[uVar26];
                  (&pPVar14->magic)[uVar26] = (uint32_t)pHVar49;
                  if ((pHVar49 == pHVar45) && (uVar7 != 0xffffffff)) {
                    uVar26 = uVar33 - uVar7;
                    if ((Hasher *)(ulong)uVar26 <= pHVar39) {
                      puVar57 = (ulong *)(ringbuffer + (uVar7 & uVar19));
                      lVar64 = 0;
                      lVar36 = 0;
                      puVar35 = puVar57;
                      do {
                        uVar43 = *(ulong *)((long)puVar52 + lVar36);
                        uVar41 = *puVar35;
                        if (uVar43 == uVar41) {
                          puVar35 = puVar35 + 1;
                        }
                        else {
                          uVar16 = 0;
                          if ((uVar41 ^ uVar43) != 0) {
                            for (; ((uVar41 ^ uVar43) >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                            }
                          }
                          pHVar30 = (Hasher *)
                                    ((long)puVar35 + ((uVar16 >> 3 & 0x1fffffff) - (long)puVar57));
                        }
                        if (uVar43 != uVar41) goto LAB_01c18e75;
                        lVar36 = lVar36 + 8;
                        lVar31 = lVar29 + lVar64;
                        lVar64 = lVar64 + -8;
                      } while (7 < lVar31 - 8U);
                      if (lVar36 != lVar29) {
                        pcVar25 = (char *)((long)puVar52 + lVar36);
                        lVar64 = lVar64 + lVar29;
                        puVar38 = (ulong *)((long)puVar35 + (lVar29 - lVar36));
                        puVar37 = puVar35;
                        do {
                          puVar35 = puVar37;
                          if ((char)*puVar37 != *pcVar25) break;
                          pcVar25 = pcVar25 + 1;
                          puVar37 = (ulong *)((long)puVar37 + 1);
                          lVar64 = lVar64 + -1;
                          puVar35 = puVar38;
                        } while (lVar64 != 0);
                      }
                      pHVar30 = (Hasher *)((long)puVar35 - (long)puVar57);
LAB_01c18e75:
                      if (((Hasher *)0x3 < pHVar30) && (local_118 < pHVar30)) {
                        iVar18 = 0x1f;
                        if (uVar26 != 0) {
                          for (; uVar26 >> iVar18 == 0; iVar18 = iVar18 + -1) {
                          }
                        }
                        pHVar28 = (Hasher *)((ulong)(iVar18 * -0x1e + 0x780) + (long)pHVar30 * 0x87)
                        ;
                        if (local_160 < pHVar28) {
                          local_118 = pHVar30;
                          local_160 = pHVar28;
                          local_140 = (Hasher *)(ulong)uVar26;
                        }
                      }
                    }
                  }
                }
                uVar47 = (uint)bVar5 + uVar47 * iVar27;
                pHVar28 = (Hasher *)(ulong)uVar47;
                uVar47 = ~(uint)bVar46 * iVar8 + uVar47 + 1;
                pHVar49 = (Hasher *)((long)(pHVar49->common).extra + 4);
              } while (pHVar49 <= pHVar45);
              *(uint *)&(params->dictionary).compound.total_size = uVar47;
            }
            (params->dictionary).compound.chunks[1] =
                 (PreparedDictionary *)((long)(local_180->common).extra + 5);
          }
          if (lVar62 != 0) {
            lVar36 = 0;
            do {
              piVar15 = *(int **)(literal_context_lut + lVar36 * 8 + 0x68);
              uVar43 = ((*puVar52 << (-(char)piVar15[3] & 0x3fU)) >> (-(char)piVar15[3] & 0x3fU)) *
                       0x1fe35a7bd3579bd3 >> (-*(byte *)(piVar15 + 4) & 0x3f);
              lVar64 = (1L << (*(byte *)(piVar15 + 5) & 0x3f)) * 4 + 0x18;
              lVar31 = (1L << (*(byte *)(piVar15 + 4) & 0x3f)) * 2 + lVar64;
              bVar46 = -*(byte *)(piVar15 + 5);
              pHVar30 = (Hasher *)(ulong)((uint)((int)uVar43 << (bVar46 & 0x1f)) >> (bVar46 & 0x1f))
              ;
              pHVar39 = (Hasher *)((long)piVar15 + (ulong)(uint)piVar15[1] * 4 + lVar31);
              if (*piVar15 != -0x21431220) {
                pHVar39 = (Hasher *)(pHVar39->common).extra[0];
              }
              pHVar48 = (Hasher *)
                        ((long)pHVar32 +
                        (lVar63 - *(long *)(literal_context_lut + lVar36 * 8 + 0x168)));
              uVar41 = (ulong)(uint)piVar15[2];
              uVar6 = *(ushort *)((long)piVar15 + (uVar43 & 0xffffffff) * 2 + lVar64);
              puVar23 = (uint *)((long)piVar15 +
                                (ulong)((uint)uVar6 +
                                       piVar15[(long)((long)(pHVar30->common).extra + 6)]) * 4 +
                                lVar31);
              lVar64 = 0;
              pHVar49 = local_118;
              pHVar28 = local_118;
              do {
                pHVar54 = (Hasher *)(long)*(int *)((long)(hasher->common).extra + lVar64 * 4);
                if (((Hasher *)((long)pHVar48 - uVar41) < pHVar54) && (pHVar54 <= pHVar48)) {
                  pHVar59 = (Hasher *)(uVar41 - ((long)pHVar48 - (long)pHVar54));
                  if (local_168 <= pHVar59) {
                    pHVar59 = local_168;
                  }
                  pHVar58 = (Hasher *)(((long)pHVar48 - (long)pHVar54) + (long)pHVar39);
                  puVar35 = puVar52;
                  pHVar28 = pHVar58;
                  for (; (Hasher *)0x7 < pHVar59;
                      pHVar59 = (Hasher *)((long)&pHVar59[-1].privat + 0x418)) {
                    pvVar12 = (void *)*puVar35;
                    pvVar13 = (pHVar28->common).extra[0];
                    if (pvVar12 == pvVar13) {
                      pHVar28 = (Hasher *)((pHVar28->common).extra + 1);
                    }
                    else {
                      uVar43 = 0;
                      if (((ulong)pvVar13 ^ (ulong)pvVar12) != 0) {
                        for (; (((ulong)pvVar13 ^ (ulong)pvVar12) >> uVar43 & 1) == 0;
                            uVar43 = uVar43 + 1) {
                        }
                      }
                      pHVar30 = (Hasher *)
                                ((long)pHVar28 + ((uVar43 >> 3 & 0x1fffffff) - (long)pHVar58));
                    }
                    if (pvVar12 != pvVar13) goto LAB_01c19085;
                    puVar35 = puVar35 + 1;
                  }
                  pHVar30 = pHVar28;
                  if (pHVar59 != (Hasher *)0x0) {
                    pHVar30 = (Hasher *)
                              ((long)(pHVar28->common).extra + (long)(pHVar59->common).extra);
                    pHVar50 = (Hasher *)0x0;
                    do {
                      if (*(char *)((long)(pHVar28->common).extra + (long)(pHVar50->common).extra)
                          != *(char *)((long)puVar35 + (long)pHVar50)) {
                        pHVar30 = (Hasher *)
                                  ((long)(pHVar28->common).extra + (long)(pHVar50->common).extra);
                        break;
                      }
                      pHVar50 = (Hasher *)((long)(pHVar50->common).extra + 1);
                    } while (pHVar59 != pHVar50);
                  }
                  pHVar30 = (Hasher *)((long)pHVar30 - (long)pHVar58);
                  pHVar28 = pHVar30;
LAB_01c19085:
                  if (((Hasher *)&DAT_00000001 < pHVar30) &&
                     (pHVar59 = (Hasher *)((long)pHVar30 * 0x87 + 0x78f), local_160 < pHVar59)) {
                    if (lVar64 != 0) {
                      pHVar59 = (Hasher *)
                                ((long)pHVar59 -
                                (ulong)((0x1ca10U >> ((byte)lVar64 & 2) & 4) + 0x27));
                    }
                    if ((local_160 < pHVar59) &&
                       (local_160 = pHVar59, local_140 = pHVar54, local_118 = pHVar30,
                       pHVar49 < pHVar30)) {
                      pHVar49 = pHVar30;
                    }
                  }
                }
                lVar64 = lVar64 + 1;
              } while (lVar64 != 4);
              if (uVar6 != 0xffff) {
                do {
                  uVar33 = *puVar23;
                  uVar43 = (ulong)(uVar33 & 0x7fffffff);
                  pHVar54 = (Hasher *)((long)pHVar48 - uVar43);
                  pHVar30 = (Hasher *)(uVar41 - uVar43);
                  if (local_168 <= (Hasher *)(uVar41 - uVar43)) {
                    pHVar30 = local_168;
                  }
                  if ((((pHVar54 <= pHVar24) &&
                       (pcVar25 = (char *)((long)(pHVar49->common).extra + uVar22),
                       pcVar25 <= ringbuffer_mask)) && (pHVar49 < pHVar30)) &&
                     (pHVar28 = pHVar39,
                     ringbuffer[(long)pcVar25] ==
                     ((char *)((long)(pHVar49->common).extra + uVar43))
                     [(long)(pHVar39->common).extra])) {
                    puVar37 = (ulong *)((long)(pHVar39->common).extra + uVar43);
                    puVar35 = puVar52;
                    puVar57 = puVar37;
                    for (; (Hasher *)0x7 < pHVar30;
                        pHVar30 = (Hasher *)((long)&pHVar30[-1].privat + 0x418)) {
                      uVar43 = *puVar35;
                      uVar16 = *puVar57;
                      if (uVar43 == uVar16) {
                        puVar57 = puVar57 + 1;
                      }
                      else {
                        uVar17 = 0;
                        if ((uVar16 ^ uVar43) != 0) {
                          for (; ((uVar16 ^ uVar43) >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                          }
                        }
                        pHVar28 = (Hasher *)
                                  ((long)puVar57 + ((uVar17 >> 3 & 0x1fffffff) - (long)puVar37));
                      }
                      if (uVar43 != uVar16) goto LAB_01c19200;
                      puVar35 = puVar35 + 1;
                    }
                    if (pHVar30 != (Hasher *)0x0) {
                      pHVar28 = (Hasher *)0x0;
                      do {
                        pHVar59 = pHVar28;
                        if (*(char *)((long)puVar57 + (long)pHVar28) !=
                            *(char *)((long)puVar35 + (long)pHVar28)) break;
                        pHVar28 = (Hasher *)((long)(pHVar28->common).extra + 1);
                        pHVar59 = pHVar30;
                      } while (pHVar30 != pHVar28);
                      puVar57 = (ulong *)((long)puVar57 + (long)pHVar59);
                    }
                    pHVar28 = (Hasher *)((long)puVar57 - (long)puVar37);
LAB_01c19200:
                    if ((Hasher *)0x3 < pHVar28) {
                      iVar27 = 0x1f;
                      if ((uint)pHVar54 != 0) {
                        for (; (uint)pHVar54 >> iVar27 == 0; iVar27 = iVar27 + -1) {
                        }
                      }
                      pHVar30 = (Hasher *)((ulong)(iVar27 * -0x1e + 0x780) + (long)pHVar28 * 0x87);
                      if (local_160 < pHVar30) {
                        pHVar49 = pHVar28;
                        local_160 = pHVar30;
                        local_140 = pHVar54;
                        local_118 = pHVar28;
                      }
                    }
                  }
                  puVar23 = puVar23 + 1;
                } while (-1 < (int)uVar33);
              }
              lVar36 = lVar36 + 1;
            } while (lVar36 != lVar62);
          }
          if (local_160 < (Hasher *)((long)&local_150->privat + 0x5f)) {
            bVar61 = false;
            local_140 = local_110;
            iVar27 = iVar34;
          }
          else {
            local_158 = local_158 + 1;
            iVar27 = iVar34 + 1;
            bVar61 = iVar34 < 3 && (int *)((long)(local_180->common).extra + 9) < piVar3;
            local_150 = local_160;
            local_180 = pHVar45;
            local_148 = local_118;
          }
          lVar29 = lVar29 + -1;
          local_110 = local_140;
          iVar34 = iVar27;
        } while (bVar61);
        pHVar24 = (Hasher *)((long)(local_180->common).extra + lVar9);
        if (pHVar51 <= pHVar24) {
          pHVar24 = pHVar51;
        }
        pHVar24 = (Hasher *)((long)(pHVar24->common).extra + lVar10);
        if (pHVar24 < local_140) {
LAB_01c19565:
          pcVar25 = (char *)((long)(local_140->common).extra + 0xf);
        }
        else {
          pHVar45 = (Hasher *)(long)*(int *)(hasher->common).extra;
          uVar33 = 0;
          bVar61 = false;
          if (local_140 != pHVar45) {
            pHVar39 = (Hasher *)(long)*(int *)((long)(hasher->common).extra + 4);
            if (local_140 == pHVar39) {
              uVar33 = 1;
LAB_01c19455:
              bVar61 = false;
            }
            else {
              pcVar25 = (char *)((long)local_140 + (3 - (long)pHVar45));
              if (pcVar25 < (char *)0x7) {
                iVar34 = (int)pcVar25;
                uVar33 = 0x9750468;
              }
              else {
                pcVar25 = (char *)((long)local_140 + (3 - (long)pHVar39));
                if ((char *)0x6 < pcVar25) {
                  if (local_140 != (Hasher *)(long)*(int *)((hasher->common).extra + 1)) {
                    bVar61 = local_140 !=
                             (Hasher *)(long)*(int *)((long)(hasher->common).extra + 0xc);
                    uVar33 = 3;
                    goto LAB_01c1955e;
                  }
                  uVar33 = 2;
                  goto LAB_01c19455;
                }
                iVar34 = (int)pcVar25;
                uVar33 = 0xfdb1ace;
              }
              uVar33 = uVar33 >> ((byte)(iVar34 << 2) & 0x1f) & 0xf;
              bVar61 = false;
            }
          }
LAB_01c1955e:
          if (bVar61) goto LAB_01c19565;
          pcVar25 = (char *)(ulong)uVar33;
        }
        if ((local_140 <= pHVar24) && (pcVar25 != (char *)0x0)) {
          *(undefined4 *)((long)(hasher->common).extra + 0xc) =
               *(undefined4 *)((hasher->common).extra + 1);
          *(void **)((long)(hasher->common).extra + 4) = (hasher->common).extra[0];
          *(int *)(hasher->common).extra = (int)local_140;
        }
        uVar47 = (uint)local_158;
        *(uint *)local_108 = uVar47;
        uVar33 = (uint)local_148;
        *(uint *)((long)local_108 + 4) = uVar33;
        pcVar2 = (char *)((ulong)*(uint *)(literal_context_lut + 0x3c) + 0x10);
        if (pcVar25 < pcVar2) {
          *(short *)((long)local_108 + 0xe) = (short)pcVar25;
          uVar26 = 0;
        }
        else {
          bVar46 = (byte)*(int *)(literal_context_lut + 0x38);
          pcVar25 = pcVar25 + ((4L << (bVar46 & 0x3f)) -
                              (ulong)*(uint *)(literal_context_lut + 0x3c)) + -0x10;
          uVar26 = 0x1f;
          if ((uint)pcVar25 != 0) {
            for (; (uint)pcVar25 >> uVar26 == 0; uVar26 = uVar26 - 1) {
            }
          }
          uVar26 = (uVar26 ^ 0xffffffe0) + 0x1f;
          bVar61 = ((ulong)pcVar25 >> ((ulong)uVar26 & 0x3f) & 1) != 0;
          iVar34 = uVar26 - *(int *)(literal_context_lut + 0x38);
          *(ushort *)((long)local_108 + 0xe) =
               (short)((uint)bVar61 + iVar34 * 2 + 0xfffe << (bVar46 & 0x3f)) +
               (short)pcVar2 + (~(ushort)(-1 << (bVar46 & 0x1f)) & (ushort)pcVar25) |
               (short)iVar34 * 0x400;
          uVar26 = (uint)((long)pcVar25 - ((ulong)bVar61 + 2 << ((byte)uVar26 & 0x3f)) >>
                         (bVar46 & 0x3f));
        }
        *(uint *)(local_108 + 1) = uVar26;
        if (5 < local_158) {
          if (local_158 < 0x82) {
            uVar47 = 0x1f;
            uVar26 = (uint)(local_158 - 2);
            if (uVar26 != 0) {
              for (; uVar26 >> uVar47 == 0; uVar47 = uVar47 - 1) {
              }
            }
            uVar47 = (int)(local_158 - 2 >> ((char)(uVar47 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar47 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_158 < 0x842) {
            uVar26 = 0x1f;
            if (uVar47 - 0x42 != 0) {
              for (; uVar47 - 0x42 >> uVar26 == 0; uVar26 = uVar26 - 1) {
              }
            }
            uVar47 = (uVar26 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar47 = 0x15;
            if (0x1841 < local_158) {
              uVar47 = (uint)(ushort)(0x17 - (local_158 < 0x5842));
            }
          }
        }
        uVar22 = (ulong)(int)uVar33;
        if (uVar22 < 10) {
          uVar26 = uVar33 - 2;
        }
        else if (uVar22 < 0x86) {
          uVar33 = 0x1f;
          uVar26 = (uint)(uVar22 - 6);
          if (uVar26 != 0) {
            for (; uVar26 >> uVar33 == 0; uVar33 = uVar33 - 1) {
            }
          }
          uVar26 = (int)(uVar22 - 6 >> ((char)(uVar33 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar33 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar26 = 0x17;
          if (uVar22 < 0x846) {
            uVar26 = 0x1f;
            if (uVar33 - 0x46 != 0) {
              for (; uVar33 - 0x46 >> uVar26 == 0; uVar26 = uVar26 - 1) {
              }
            }
            uVar26 = (uVar26 ^ 0xffe0) + 0x2c;
          }
        }
        uVar6 = (ushort)uVar26;
        sVar42 = (uVar6 & 7) + ((ushort)uVar47 & 7) * 8;
        if ((((*(ushort *)((long)local_108 + 0xe) & 0x3ff) == 0) && ((ushort)uVar47 < 8)) &&
           (uVar6 < 0x10)) {
          if (7 < uVar6) {
            sVar42 = sVar42 + 0x40;
          }
        }
        else {
          iVar34 = ((uVar47 & 0xffff) >> 3) * 3 + ((uVar26 & 0xffff) >> 3);
          sVar42 = sVar42 + ((ushort)(0x520d40 >> ((char)iVar34 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar34 * 0x40 + 0x40;
        }
        *(short *)((long)local_108 + 0xc) = sVar42;
        *num_commands = *num_commands + local_158;
        position = (long)(local_180->common).extra + (long)(local_148->common).extra;
        pHVar24 = pHVar21;
        if (position < pHVar21) {
          pHVar24 = (Hasher *)position;
        }
        pHVar45 = (Hasher *)((long)(local_180->common).extra + 2);
        if (local_140 < (Hasher *)((ulong)local_148 >> 2)) {
          pHVar39 = (Hasher *)(position + (long)local_140 * -4);
          if (pHVar39 < pHVar45) {
            pHVar39 = pHVar45;
          }
          pHVar45 = pHVar39;
          if (pHVar24 < pHVar39) {
            pHVar45 = pHVar24;
          }
        }
        local_138 = (Hasher *)
                    ((char *)((long)(pHVar40->common).extra + (long)local_148 * 2) +
                    (long)(local_180->common).extra);
        local_108 = local_108 + 2;
        if (pHVar45 < pHVar24) {
          do {
            *(uint *)((long)(pHVar11->common).extra +
                     (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                     ((ulong)pHVar45 & ringbuffer_mask)) *
                                           -0x1ca5842ca8642d00) >> 0x2c) + ((uint)pHVar45 & 0x18) &
                            0xfffff) * 4) = (uint)pHVar45;
            pHVar45 = (Hasher *)((long)(pHVar45->common).extra + 1);
          } while (pHVar24 != pHVar45);
        }
        local_158 = 0;
      }
      local_180 = (Hasher *)position;
    } while ((((Hasher *)position)->common).extra + 1 < piVar3);
  }
  else {
    local_108 = last_insert_len;
  }
  *(char **)dist_cache = (char *)((long)piVar3 + (local_158 - position));
  *(long *)commands = *(long *)commands + ((long)local_108 - (long)last_insert_len >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}